

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

string * jsonnet::internal::jsonnet_vm_execute
                   (Allocator *alloc,AST *ast,ExtMap *ext_vars,uint max_stack,double gc_min_objects,
                   double gc_growth_trigger,VmNativeCallbackMap *natives,
                   JsonnetImportCallback *import_callback,void *ctx,bool string_output)

{
  Interpreter *in_RDI;
  UString *in_stack_00000010;
  byte in_stack_00000018;
  bool in_stack_0000001f;
  LocationRange *in_stack_00000020;
  Interpreter *in_stack_00000028;
  Interpreter vm;
  JsonnetImportCallback *in_stack_000009b8;
  VmNativeCallbackMap *in_stack_000009c0;
  double in_stack_000009c8;
  double in_stack_000009d0;
  uint in_stack_000009dc;
  ExtMap *in_stack_000009e0;
  Allocator *in_stack_000009e8;
  Interpreter *in_stack_000009f0;
  void *in_stack_00000a00;
  uint in_stack_000032e4;
  AST *in_stack_000032e8;
  Interpreter *in_stack_000032f0;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffc60;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *this;
  Interpreter *this_00;
  allocator<char> *in_stack_fffffffffffffc90;
  char32_t *in_stack_fffffffffffffc98;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_fffffffffffffca0;
  allocator<char> local_341;
  string local_340 [128];
  undefined4 local_2c0;
  allocator<char> local_2b9;
  string local_2b8 [280];
  LocationRange *in_stack_fffffffffffffe60;
  Interpreter *in_stack_fffffffffffffe68;
  
  this_00 = in_RDI;
  anon_unknown_0::Interpreter::Interpreter
            (in_stack_000009f0,in_stack_000009e8,in_stack_000009e0,in_stack_000009dc,
             in_stack_000009d0,in_stack_000009c8,in_stack_000009c0,in_stack_000009b8,
             in_stack_00000a00);
  anon_unknown_0::Interpreter::evaluate(in_stack_000032f0,in_stack_000032e8,in_stack_000032e4);
  if ((in_stack_00000018 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
              );
    LocationRange::LocationRange((LocationRange *)this_00,(string *)in_RDI);
    this = (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
           &stack0xfffffffffffffc97;
    std::allocator<char32_t>::allocator((allocator<char32_t> *)0x2bb0b0);
    std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              (in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
               (allocator<char32_t> *)in_stack_fffffffffffffc90);
    anon_unknown_0::Interpreter::manifestJson
              (in_stack_00000028,in_stack_00000020,in_stack_0000001f,in_stack_00000010);
    encode_utf8((UString *)in_RDI);
    std::__cxx11::u32string::~u32string(this);
    std::__cxx11::u32string::~u32string(this);
    std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x2bb126);
    LocationRange::~LocationRange((LocationRange *)0x2bb133);
    std::__cxx11::string::~string(local_340);
    std::allocator<char>::~allocator(&local_341);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
              );
    LocationRange::LocationRange((LocationRange *)this_00,(string *)in_RDI);
    (anonymous_namespace)::Interpreter::manifestString_abi_cxx11_
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
    encode_utf8((UString *)in_RDI);
    std::__cxx11::u32string::~u32string(in_stack_fffffffffffffc60);
    LocationRange::~LocationRange((LocationRange *)0x2baf94);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
  }
  local_2c0 = 1;
  anon_unknown_0::Interpreter::~Interpreter(this_00);
  return (string *)this_00;
}

Assistant:

std::string jsonnet_vm_execute(Allocator *alloc, const AST *ast, const ExtMap &ext_vars,
                               unsigned max_stack, double gc_min_objects, double gc_growth_trigger,
                               const VmNativeCallbackMap &natives,
                               JsonnetImportCallback *import_callback, void *ctx,
                               bool string_output)
{
    Interpreter vm(alloc,
                   ext_vars,
                   max_stack,
                   gc_min_objects,
                   gc_growth_trigger,
                   natives,
                   import_callback,
                   ctx);
    vm.evaluate(ast, 0);
    if (string_output) {
        return encode_utf8(vm.manifestString(LocationRange("During manifestation")));
    } else {
        return encode_utf8(vm.manifestJson(LocationRange("During manifestation"), true, U""));
    }
}